

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

optional<pbrt::CameraRayDifferential> * __thiscall
pbrt::PerspectiveCamera::GenerateRayDifferential
          (PerspectiveCamera *this,CameraSample sample,SampledWavelengths *lambda)

{
  Point3<float> p;
  Point3<float> p_00;
  Point3<float> p_01;
  Point3<float> p_02;
  Point3<float> p_03;
  Vector3<float> v;
  Vector3<float> v_00;
  Point3<float> p_04;
  Vector3<float> v_01;
  Vector3<float> v_02;
  Point3<float> p_05;
  Vector3<float> c;
  Vector3<float> c_00;
  Tuple3<pbrt::Vector3,_float> t;
  Tuple3<pbrt::Vector3,_float> t_00;
  Point2f u;
  Point2f u_00;
  Vector3<float> v_03;
  Vector3<float> v_04;
  Vector3<float> v_05;
  Vector3<float> v_06;
  Vector3<float> v_07;
  Vector3<float> v_08;
  Vector3<float> v_09;
  long in_RSI;
  undefined8 in_RDI;
  Float FVar1;
  undefined1 auVar27 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  Point3<float> PVar28;
  Vector3<float> VVar29;
  Point3f PVar30;
  Vector3f dy;
  Point3f pFocus_1;
  Float ft_1;
  Vector3f dx;
  Point2f pLens_1;
  Point3f pFocus;
  Float ft;
  Point2f pLens;
  RayDifferential ray;
  Vector3f dir;
  Point3f pCamera;
  Point3f pFilm;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffff8e8;
  CameraBase *in_stack_fffffffffffff8f0;
  undefined4 in_stack_fffffffffffff8f8;
  undefined4 in_stack_fffffffffffff8fc;
  undefined4 in_stack_fffffffffffff900;
  float in_stack_fffffffffffff904;
  undefined8 in_stack_fffffffffffff910;
  undefined1 *puVar31;
  float in_stack_fffffffffffff918;
  float in_stack_fffffffffffff920;
  float fVar32;
  float in_stack_fffffffffffff928;
  float in_stack_fffffffffffff92c;
  undefined4 uVar33;
  Float t_01;
  float in_stack_fffffffffffff940;
  undefined4 uVar34;
  undefined1 *puVar35;
  undefined4 in_stack_fffffffffffff950;
  Tuple3<pbrt::Vector3,_float> in_stack_fffffffffffff968;
  Tuple3<pbrt::Point3,_float> in_stack_fffffffffffff988;
  Float local_5b8 [4];
  float local_5a4;
  Float local_5a0 [2];
  float local_598;
  Float local_590 [2];
  Float in_stack_fffffffffffffa78;
  Float in_stack_fffffffffffffa7c;
  undefined8 in_stack_fffffffffffffa90;
  float in_stack_fffffffffffffa98;
  undefined1 local_534 [12];
  Float local_528 [2];
  float local_520;
  Float local_518 [2];
  float local_510;
  undefined8 local_508;
  float local_500;
  Tuple3<pbrt::Vector3,_float> local_4f8;
  Tuple3<pbrt::Vector3,_float> local_4e8 [2];
  Float local_4d0;
  float local_4c8;
  float fStack_4c4;
  Float local_4c0;
  Tuple3<pbrt::Vector3,_float> local_4b8 [2];
  float local_4a0;
  float local_49c;
  float fStack_498;
  Float local_494;
  Tuple3<pbrt::Vector3,_float> local_490;
  Float local_480 [2];
  float local_478;
  Float local_470 [2];
  float local_468;
  Float local_460 [2];
  float local_458;
  Float local_450 [2];
  float local_448;
  Float local_440 [2];
  float local_438;
  undefined1 local_434 [12];
  Tuple3<pbrt::Vector3,_float> local_428;
  Float local_418 [2];
  float local_410;
  DerivativeTerm local_408;
  undefined8 local_3f8;
  float local_3f0;
  undefined8 local_3e8;
  float local_3e0;
  undefined8 local_3d8;
  Float local_3d0;
  undefined8 local_3c8;
  Float local_3c0;
  undefined8 local_3b8;
  float local_3b0;
  DerivativeTerm local_3ac;
  Float FStack_39c;
  float local_398;
  Float local_390 [2];
  float local_388;
  DerivativeTerm local_380;
  DerivativeTerm local_370;
  float local_360;
  float fStack_35c;
  Float local_358;
  float local_350;
  float fStack_34c;
  Float local_348;
  DerivativeTerm local_340;
  Float local_330 [2];
  float local_328;
  float local_324;
  float fStack_320;
  Float local_31c;
  Tuple3<pbrt::Vector3,_float> local_318;
  Float local_308 [2];
  float local_300;
  Float local_2f8 [2];
  float local_2f0;
  Float local_2e8 [2];
  float local_2e0;
  Float local_2d8 [2];
  float local_2d0;
  Float local_2c8 [2];
  float local_2c0;
  undefined1 local_2bc [12];
  Tuple3<pbrt::Vector3,_float> local_2b0;
  float local_2a4;
  Float local_2a0 [2];
  float local_298;
  Float local_290;
  Float FStack_28c;
  Float local_288;
  undefined8 local_280;
  float local_278;
  undefined8 local_270;
  float local_268;
  Tuple3<pbrt::Vector3,_float> local_260;
  Tuple3<pbrt::Vector3,_float> local_250 [2];
  float local_238;
  Float local_234;
  Float FStack_230;
  Float local_22c;
  Float local_228 [2];
  float local_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined8 local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  float local_1f0;
  undefined8 local_1e8;
  float local_1e0;
  undefined8 local_1d8;
  float local_1d0;
  float local_1c8;
  float fStack_1c4;
  Float local_1c0;
  float local_1b8;
  float fStack_1b4;
  Float local_1b0;
  undefined8 local_1a8;
  float local_1a0;
  undefined8 local_198;
  float local_190;
  float local_18c;
  float fStack_188;
  Float local_184;
  undefined8 local_180;
  float local_178;
  undefined8 local_170;
  float local_168;
  float local_164;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  float local_138;
  undefined8 local_130;
  undefined4 local_128;
  undefined8 local_118;
  float local_110;
  undefined8 local_10c;
  undefined4 local_104;
  float local_100;
  float fStack_fc;
  Float local_f8;
  undefined8 local_f4;
  float local_ec;
  undefined1 local_d8;
  float local_d4;
  float fStack_d0;
  Float local_cc;
  float local_c8;
  float fStack_c4;
  Float local_c0;
  Float local_bc [2];
  float local_b4;
  undefined8 local_b0;
  float local_a8;
  undefined8 local_a0;
  float local_98;
  undefined8 local_90;
  undefined4 local_88;
  undefined8 local_7c;
  undefined4 local_74;
  undefined8 local_70;
  float local_68;
  undefined8 local_60;
  float local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined8 local_40;
  undefined4 local_38;
  undefined8 local_30;
  float local_28;
  undefined8 local_24;
  undefined4 local_1c;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  uVar33 = (undefined4)in_RDI;
  t_01 = (Float)((ulong)in_RDI >> 0x20);
  puVar35 = &stack0x00000008;
  uVar34 = 0;
  Point3<float>::Point3
            ((Point3<float> *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8.y,
             in_stack_fffffffffffff8e8.x,0.0);
  local_38 = local_1c;
  local_40 = local_24;
  local_48 = local_1c;
  local_50 = local_24;
  auVar27 = ZEXT856(0);
  PVar28.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffa98;
  PVar28.super_Tuple3<pbrt::Point3,_float>.x = (Float)in_stack_fffffffffffffa90;
  PVar28.super_Tuple3<pbrt::Point3,_float>.y = SUB84(in_stack_fffffffffffffa90,4);
  PVar28 = Transform::operator()
                     ((Transform *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                      PVar28);
  local_58 = PVar28.super_Tuple3<pbrt::Point3,_float>.z;
  auVar2._0_8_ = PVar28.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar2._8_56_ = auVar27;
  local_60 = vmovlpd_avx(auVar2._0_16_);
  local_30 = local_60;
  local_28 = local_58;
  Vector3<float>::Vector3
            ((Vector3<float> *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8.y,
             in_stack_fffffffffffff8e8.x,0.0);
  local_88 = local_74;
  local_90 = local_7c;
  auVar27 = ZEXT856(0);
  VVar29.super_Tuple3<pbrt::Vector3,_float>.y = t_01;
  VVar29.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar33;
  VVar29.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff940;
  VVar29 = Normalize<float>(VVar29);
  local_98 = VVar29.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar3._0_8_ = VVar29.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar3._8_56_ = auVar27;
  local_a0 = vmovlpd_avx(auVar3._0_16_);
  local_70 = local_a0;
  local_68 = local_98;
  Point3<float>::Point3
            ((Point3<float> *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8.y,
             in_stack_fffffffffffff8e8.x,0.0);
  local_110 = local_68;
  local_118 = local_70;
  FVar1 = CameraBase::SampleTime(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8.y);
  Medium::Medium((Medium *)in_stack_fffffffffffff8f0,(Medium *)in_stack_fffffffffffff8e8);
  local_128 = local_104;
  local_130 = local_10c;
  local_138 = local_110;
  local_140 = local_118;
  RayDifferential::RayDifferential
            ((RayDifferential *)CONCAT44(FVar1,in_stack_fffffffffffff950),
             (Point3f)in_stack_fffffffffffff988,(Vector3f)in_stack_fffffffffffff968,
             (Float)((ulong)puVar35 >> 0x20),(Medium *)CONCAT44(uVar34,in_stack_fffffffffffff940));
  if (0.0 < *(float *)(in_RSI + 0x580)) {
    in_stack_fffffffffffff92c = *(float *)(in_RSI + 0x580);
    local_160 = *(undefined8 *)(puVar35 + 8);
    u.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffff92c;
    u.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffff928;
    auVar4._0_8_ = SampleUniformDiskConcentric(u);
    auVar4._8_56_ = extraout_var;
    local_158 = vmovlpd_avx(auVar4._0_16_);
    local_150 = local_158;
    auVar5._0_8_ = pbrt::operator*(0.0,in_stack_fffffffffffff8e8);
    auVar5._8_56_ = extraout_var_00;
    local_148 = vmovlpd_avx(auVar5._0_16_);
    local_164 = *(float *)(in_RSI + 0x584) / local_ec;
    auVar27 = (undefined1  [56])0x0;
    PVar30 = Ray::operator()((Ray *)CONCAT44(uVar34,in_stack_fffffffffffff940),t_01);
    local_178 = PVar30.super_Tuple3<pbrt::Point3,_float>.z;
    auVar6._0_8_ = PVar30.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar6._8_56_ = auVar27;
    local_180 = vmovlpd_avx(auVar6._0_16_);
    local_170 = local_180;
    local_168 = local_178;
    Point3<float>::Point3
              ((Point3<float> *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8.y,
               in_stack_fffffffffffff8e8.x,0.0);
    local_f8 = local_184;
    local_100 = local_18c;
    fStack_fc = fStack_188;
    local_1b0 = local_184;
    local_1b8 = local_18c;
    fStack_1b4 = fStack_188;
    local_1c0 = local_184;
    local_1c8 = local_18c;
    fStack_1c4 = fStack_188;
    auVar27 = ZEXT856(0);
    p_03.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff918;
    p_03.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffff910;
    p_03.super_Tuple3<pbrt::Point3,_float>.y =
         (float)(int)((ulong)in_stack_fffffffffffff910 >> 0x20);
    VVar29 = Point3<float>::operator-
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),p_03);
    local_1e0 = VVar29.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar7._0_8_ = VVar29.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar7._8_56_ = auVar27;
    local_1e8 = vmovlpd_avx(auVar7._0_16_);
    auVar27 = ZEXT856(0);
    v_03.super_Tuple3<pbrt::Vector3,_float>.y = t_01;
    v_03.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar33;
    v_03.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff940;
    local_1d8 = local_1e8;
    local_1d0 = local_1e0;
    local_1a8 = local_1e8;
    local_1a0 = local_1e0;
    VVar29 = Normalize<float>(v_03);
    local_1f0 = VVar29.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar8._0_8_ = VVar29.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar8._8_56_ = auVar27;
    local_1f8 = vmovlpd_avx(auVar8._0_16_);
    local_198 = local_1f8;
    local_190 = local_1f0;
    local_f4 = local_1f8;
    local_ec = local_1f0;
  }
  if (*(float *)(in_RSI + 0x580) <= 0.0) {
    local_c0 = local_f8;
    local_c8 = local_100;
    fStack_c4 = fStack_fc;
    local_cc = local_f8;
    local_d4 = local_100;
    fStack_d0 = fStack_fc;
    in_stack_fffffffffffff8e8 = (Tuple2<pbrt::Point2,_float>)local_534;
    p_01.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff900;
    p_01.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff8fc;
    p_01.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff904;
    Vector3<float>::Vector3<float>((Vector3<float> *)0x8a6329,p_01);
    auVar27 = ZEXT856(0);
    c.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff918;
    c.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff910;
    c.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffff910 >> 0x20);
    VVar29 = Tuple3<pbrt::Vector3,float>::operator+
                       ((Tuple3<pbrt::Vector3,_float> *)
                        CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),c);
    local_520 = VVar29.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar23._0_8_ = VVar29.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar23._8_56_ = auVar27;
    local_590 = (Float  [2])vmovlpd_avx(auVar23._0_16_);
    auVar27 = ZEXT856(0);
    v_08.super_Tuple3<pbrt::Vector3,_float>.y = t_01;
    v_08.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar33;
    v_08.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff940;
    local_528 = local_590;
    VVar29 = Normalize<float>(v_08);
    local_598 = VVar29.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar24._0_8_ = VVar29.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar24._8_56_ = auVar27;
    local_5a0 = (Float  [2])vmovlpd_avx(auVar24._0_16_);
    in_stack_fffffffffffff8f0 = (CameraBase *)&stack0xfffffffffffffa3c;
    p_02.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff900;
    p_02.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff8fc;
    p_02.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff904;
    local_518 = local_5a0;
    local_510 = local_598;
    local_bc = local_5a0;
    local_b4 = local_598;
    Vector3<float>::Vector3<float>((Vector3<float> *)0x8a6496,p_02);
    auVar27 = ZEXT856(0);
    c_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff918;
    c_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff910;
    c_00.super_Tuple3<pbrt::Vector3,_float>.y =
         (float)(int)((ulong)in_stack_fffffffffffff910 >> 0x20);
    VVar29 = Tuple3<pbrt::Vector3,float>::operator+
                       ((Tuple3<pbrt::Vector3,_float> *)
                        CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),c_00);
    local_5b8[2] = VVar29.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar25._0_8_ = VVar29.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar25._8_56_ = auVar27;
    local_5b8._0_8_ = vmovlpd_avx(auVar25._0_16_);
    auVar27 = ZEXT856(0);
    v_09.super_Tuple3<pbrt::Vector3,_float>.y = t_01;
    v_09.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar33;
    v_09.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff940;
    VVar29 = Normalize<float>(v_09);
    local_5a4 = VVar29.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar26._0_8_ = VVar29.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar26._8_56_ = auVar27;
    unique0x00006b80 = vmovlpd_avx(auVar26._0_16_);
    local_b0 = unique0x00006b80;
    local_a8 = local_5a4;
  }
  else {
    in_stack_fffffffffffff8fc = *(undefined4 *)(in_RSI + 0x580);
    local_218 = *(undefined8 *)(puVar35 + 8);
    u_00.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffff92c;
    u_00.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffff928;
    auVar9._0_8_ = SampleUniformDiskConcentric(u_00);
    auVar9._8_56_ = extraout_var_01;
    local_210 = vmovlpd_avx(auVar9._0_16_);
    local_208 = local_210;
    auVar10._0_8_ = pbrt::operator*(0.0,in_stack_fffffffffffff8e8);
    auVar10._8_56_ = extraout_var_02;
    local_200 = vmovlpd_avx(auVar10._0_16_);
    local_260.z = *(float *)(in_RSI + 0x590);
    local_260._0_8_ = *(undefined8 *)(in_RSI + 0x588);
    auVar27 = ZEXT856(0);
    v.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff918;
    v.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff910;
    v.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffff910 >> 0x20);
    local_250[0]._0_8_ = local_260._0_8_;
    local_250[0].z = local_260.z;
    PVar28 = Point3<float>::operator+
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),v);
    local_278 = PVar28.super_Tuple3<pbrt::Point3,_float>.z;
    auVar11._0_8_ = PVar28.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar11._8_56_ = auVar27;
    local_280 = vmovlpd_avx(auVar11._0_16_);
    p.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff900;
    p.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff8fc;
    p.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff904;
    local_270 = local_280;
    local_268 = local_278;
    local_250[1]._4_8_ = local_280;
    local_238 = local_278;
    Vector3<float>::Vector3<float>((Vector3<float> *)0x8a5bbf,p);
    local_288 = local_22c;
    local_290 = local_234;
    FStack_28c = FStack_230;
    auVar27 = ZEXT856(0);
    v_04.super_Tuple3<pbrt::Vector3,_float>.y = t_01;
    v_04.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar33;
    v_04.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff940;
    VVar29 = Normalize<float>(v_04);
    local_298 = VVar29.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar12._0_8_ = VVar29.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar12._8_56_ = auVar27;
    local_2a0 = (Float  [2])vmovlpd_avx(auVar12._0_16_);
    local_2a4 = *(float *)(in_RSI + 0x584) / local_298;
    puVar35 = local_2bc;
    uVar34 = 0;
    local_228 = local_2a0;
    local_220 = local_298;
    Point3<float>::Point3
              ((Point3<float> *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8.y,
               in_stack_fffffffffffff8e8.x,0.0);
    auVar27 = (undefined1  [56])0x0;
    local_2d0 = local_220;
    local_2d8[0] = local_228[0];
    local_2d8[1] = local_228[1];
    local_2e0 = local_220;
    local_2e8[0] = local_228[0];
    local_2e8[1] = local_228[1];
    t.y = (float)uVar34;
    t.x = in_stack_fffffffffffff918;
    t.z = in_stack_fffffffffffff920;
    VVar29 = pbrt::operator*((float)((ulong)puVar35 >> 0x20),t);
    local_300 = VVar29.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar13._0_8_ = VVar29.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar13._8_56_ = auVar27;
    local_308 = (Float  [2])vmovlpd_avx(auVar13._0_16_);
    auVar27 = ZEXT856(0);
    v_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff918;
    v_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff910;
    v_00.super_Tuple3<pbrt::Vector3,_float>.y =
         (float)(int)((ulong)in_stack_fffffffffffff910 >> 0x20);
    local_2f8 = local_308;
    local_2f0 = local_300;
    local_2c8 = local_308;
    local_2c0 = local_300;
    PVar28 = Point3<float>::operator+
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),v_00);
    local_318.z = PVar28.super_Tuple3<pbrt::Point3,_float>.z;
    auVar14._0_8_ = PVar28.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar14._8_56_ = auVar27;
    local_318._0_8_ = vmovlpd_avx(auVar14._0_16_);
    local_2b0._0_8_ = local_318._0_8_;
    local_2b0.z = local_318.z;
    Point3<float>::Point3
              ((Point3<float> *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8.y,
               in_stack_fffffffffffff8e8.x,0.0);
    local_cc = local_31c;
    local_d4 = local_324;
    fStack_d0 = fStack_320;
    local_348 = local_31c;
    local_350 = local_324;
    fStack_34c = fStack_320;
    local_358 = local_31c;
    local_360 = local_324;
    fStack_35c = fStack_320;
    auVar27 = ZEXT856(0);
    fVar32 = SUB84(&local_2b0,0);
    p_04.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff918;
    p_04.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffff910;
    p_04.super_Tuple3<pbrt::Point3,_float>.y =
         (float)(int)((ulong)in_stack_fffffffffffff910 >> 0x20);
    VVar29 = Point3<float>::operator-
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),p_04);
    local_380.ky = VVar29.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar15._0_8_ = VVar29.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar15._8_56_ = auVar27;
    local_380._0_8_ = vmovlpd_avx(auVar15._0_16_);
    auVar27 = ZEXT856(0);
    v_05.super_Tuple3<pbrt::Vector3,_float>.y = t_01;
    v_05.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar33;
    v_05.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff940;
    local_370._0_8_ = local_380._0_8_;
    local_370.ky = local_380.ky;
    local_340._0_8_ = local_380._0_8_;
    local_340.ky = local_380.ky;
    VVar29 = Normalize<float>(v_05);
    local_388 = VVar29.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar16._0_8_ = VVar29.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar16._8_56_ = auVar27;
    local_390 = (Float  [2])vmovlpd_avx(auVar16._0_16_);
    local_3d0 = *(Float *)(in_RSI + 0x59c);
    local_3d8 = *(undefined8 *)(in_RSI + 0x594);
    auVar27 = ZEXT856(0);
    v_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff918;
    v_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff910;
    v_01.super_Tuple3<pbrt::Vector3,_float>.y =
         (float)(int)((ulong)in_stack_fffffffffffff910 >> 0x20);
    local_3c8 = local_3d8;
    local_3c0 = local_3d0;
    local_330 = local_390;
    local_328 = local_388;
    local_bc = local_390;
    local_b4 = local_388;
    PVar28 = Point3<float>::operator+
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),v_01);
    local_3f0 = PVar28.super_Tuple3<pbrt::Point3,_float>.z;
    auVar17._0_8_ = PVar28.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar17._8_56_ = auVar27;
    local_3f8 = vmovlpd_avx(auVar17._0_16_);
    p_00.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)puVar35;
    p_00.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff8fc;
    p_00.super_Tuple3<pbrt::Point3,_float>.z = (float)((ulong)puVar35 >> 0x20);
    local_3e8 = local_3f8;
    local_3e0 = local_3f0;
    local_3b8 = local_3f8;
    local_3b0 = local_3f0;
    Vector3<float>::Vector3<float>((Vector3<float> *)0x8a5f7f,p_00);
    local_408.ky = local_3ac.ky;
    local_408.kc = local_3ac.kc;
    local_408.kx = local_3ac.kx;
    auVar27 = ZEXT856(0);
    v_06.super_Tuple3<pbrt::Vector3,_float>.y = t_01;
    v_06.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar33;
    v_06.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff940;
    VVar29 = Normalize<float>(v_06);
    local_410 = VVar29.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar18._0_8_ = VVar29.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar18._8_56_ = auVar27;
    local_418 = (Float  [2])vmovlpd_avx(auVar18._0_16_);
    local_2a4 = *(float *)(in_RSI + 0x584) / local_410;
    puVar31 = local_434;
    unique0x10000b6b = local_418;
    local_398 = local_410;
    Point3<float>::Point3
              ((Point3<float> *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8.y,
               in_stack_fffffffffffff8e8.x,0.0);
    auVar27 = (undefined1  [56])0x0;
    local_448 = local_398;
    local_450[0] = local_3ac.kz;
    local_450[1] = FStack_39c;
    local_458 = local_398;
    local_460[0] = local_3ac.kz;
    local_460[1] = FStack_39c;
    t_00.y = (float)uVar34;
    t_00.x = in_stack_fffffffffffff918;
    t_00.z = fVar32;
    VVar29 = pbrt::operator*((float)((ulong)puVar35 >> 0x20),t_00);
    local_478 = VVar29.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar19._0_8_ = VVar29.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar19._8_56_ = auVar27;
    local_480 = (Float  [2])vmovlpd_avx(auVar19._0_16_);
    auVar27 = ZEXT856(0);
    v_02.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff918;
    v_02.super_Tuple3<pbrt::Vector3,_float>._0_8_ = puVar31;
    local_470 = local_480;
    local_468 = local_478;
    local_440 = local_480;
    local_438 = local_478;
    PVar28 = Point3<float>::operator+
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),v_02);
    local_490.z = PVar28.super_Tuple3<pbrt::Point3,_float>.z;
    auVar20._0_8_ = PVar28.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar20._8_56_ = auVar27;
    local_490._0_8_ = vmovlpd_avx(auVar20._0_16_);
    local_428._0_8_ = local_490._0_8_;
    local_428.z = local_490.z;
    local_2b0._0_8_ = local_490._0_8_;
    local_2b0.z = local_490.z;
    Point3<float>::Point3
              ((Point3<float> *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8.y,
               in_stack_fffffffffffff8e8.x,0.0);
    local_c0 = local_494;
    local_c8 = local_49c;
    fStack_c4 = fStack_498;
    local_4c0 = local_494;
    local_4c8 = local_49c;
    fStack_4c4 = fStack_498;
    local_4d0 = local_494;
    local_4e8[1].y = local_49c;
    local_4e8[1].z = fStack_498;
    auVar27 = ZEXT856(0);
    p_05.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff918;
    p_05.super_Tuple3<pbrt::Point3,_float>._0_8_ = puVar31;
    VVar29 = Point3<float>::operator-
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),p_05);
    local_4f8.z = VVar29.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar21._0_8_ = VVar29.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar21._8_56_ = auVar27;
    local_4f8._0_8_ = vmovlpd_avx(auVar21._0_16_);
    auVar27 = ZEXT856(0);
    v_07.super_Tuple3<pbrt::Vector3,_float>.y = t_01;
    v_07.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar33;
    v_07.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff940;
    local_4e8[0]._0_8_ = local_4f8._0_8_;
    local_4e8[0].z = local_4f8.z;
    local_4b8[0]._0_8_ = local_4f8._0_8_;
    local_4b8[0].z = local_4f8.z;
    VVar29 = Normalize<float>(v_07);
    local_500 = VVar29.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar22._0_8_ = VVar29.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar22._8_56_ = auVar27;
    local_508 = vmovlpd_avx(auVar22._0_16_);
    local_4b8[1]._4_8_ = local_508;
    local_4a0 = local_500;
    local_b0 = local_508;
    local_a8 = local_500;
  }
  local_d8 = 1;
  CameraBase::RenderFromCamera
            ((CameraBase *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
             (RayDifferential *)in_stack_fffffffffffff8f0);
  SampledSpectrum::SampledSpectrum
            ((SampledSpectrum *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8.y);
  pstd::optional<pbrt::CameraRayDifferential>::optional
            ((optional<pbrt::CameraRayDifferential> *)in_stack_fffffffffffff8f0,
             (CameraRayDifferential *)in_stack_fffffffffffff8e8);
  return (optional<pbrt::CameraRayDifferential> *)CONCAT44(t_01,uVar33);
}

Assistant:

PBRT_CPU_GPU pstd::optional<CameraRayDifferential> PerspectiveCamera::GenerateRayDifferential(
    CameraSample sample, SampledWavelengths &lambda) const {
    // Compute raster and camera sample positions
    Point3f pFilm = Point3f(sample.pFilm.x, sample.pFilm.y, 0);
    Point3f pCamera = cameraFromRaster(pFilm);
    Vector3f dir = Normalize(Vector3f(pCamera.x, pCamera.y, pCamera.z));
    RayDifferential ray(Point3f(0, 0, 0), dir, SampleTime(sample.time), medium);
    // Modify ray for depth of field
    if (lensRadius > 0) {
        // Sample point on lens
        Point2f pLens = lensRadius * SampleUniformDiskConcentric(sample.pLens);

        // Compute point on plane of focus
        Float ft = focalDistance / ray.d.z;
        Point3f pFocus = ray(ft);

        // Update ray for effect of lens
        ray.o = Point3f(pLens.x, pLens.y, 0);
        ray.d = Normalize(pFocus - ray.o);
    }

    // Compute offset rays for _PerspectiveCamera_ ray differentials
    if (lensRadius > 0) {
        // Compute _PerspectiveCamera_ ray differentials accounting for lens
        // Sample point on lens
        Point2f pLens = lensRadius * SampleUniformDiskConcentric(sample.pLens);

        // Compute $x$ ray differential for _PerspectiveCamera_ with lens
        Vector3f dx = Normalize(Vector3f(pCamera + dxCamera));
        Float ft = focalDistance / dx.z;
        Point3f pFocus = Point3f(0, 0, 0) + (ft * dx);
        ray.rxOrigin = Point3f(pLens.x, pLens.y, 0);
        ray.rxDirection = Normalize(pFocus - ray.rxOrigin);

        // Compute $y$ ray differential for _PerspectiveCamera_ with lens
        Vector3f dy = Normalize(Vector3f(pCamera + dyCamera));
        ft = focalDistance / dy.z;
        pFocus = Point3f(0, 0, 0) + (ft * dy);
        ray.ryOrigin = Point3f(pLens.x, pLens.y, 0);
        ray.ryDirection = Normalize(pFocus - ray.ryOrigin);

    } else {
        ray.rxOrigin = ray.ryOrigin = ray.o;
        ray.rxDirection = Normalize(Vector3f(pCamera) + dxCamera);
        ray.ryDirection = Normalize(Vector3f(pCamera) + dyCamera);
    }

    ray.hasDifferentials = true;
    return CameraRayDifferential{RenderFromCamera(ray)};
}